

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O3

void event_config_free(event_config *cfg)

{
  event_config_entry **ppeVar1;
  char *__ptr;
  event_config *peVar2;
  event_config_entry *__ptr_00;
  
  __ptr_00 = (cfg->entries).tqh_first;
  do {
    if (__ptr_00 == (event_config_entry *)0x0) {
      if (mm_free_fn_ != (_func_void_void_ptr *)0x0) {
        (*mm_free_fn_)(cfg);
        return;
      }
      free(cfg);
      return;
    }
    peVar2 = (event_config *)(__ptr_00->next).tqe_next;
    ppeVar1 = (__ptr_00->next).tqe_prev;
    if (peVar2 == (event_config *)0x0) {
      peVar2 = cfg;
    }
    (peVar2->entries).tqh_last = ppeVar1;
    *ppeVar1 = (__ptr_00->next).tqe_next;
    __ptr = __ptr_00->avoid_method;
    if (__ptr == (char *)0x0) {
LAB_0022a24d:
      if (mm_free_fn_ == (_func_void_void_ptr *)0x0) goto LAB_0022a25e;
      (*mm_free_fn_)(__ptr_00);
    }
    else {
      if (mm_free_fn_ != (_func_void_void_ptr *)0x0) {
        (*mm_free_fn_)(__ptr);
        goto LAB_0022a24d;
      }
      free(__ptr);
LAB_0022a25e:
      free(__ptr_00);
    }
    __ptr_00 = (cfg->entries).tqh_first;
  } while( true );
}

Assistant:

void
event_config_free(struct event_config *cfg)
{
	struct event_config_entry *entry;

	while ((entry = TAILQ_FIRST(&cfg->entries)) != NULL) {
		TAILQ_REMOVE(&cfg->entries, entry, next);
		event_config_entry_free(entry);
	}
	mm_free(cfg);
}